

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::GetReturnDropKeepCount
          (BinaryReaderInterp *this,Index *out_drop_count,Index *out_keep_count)

{
  Result RVar1;
  Index IVar2;
  
  RVar1 = GetBrDropKeepCount(this,(int)((ulong)((long)(this->label_stack_).
                                                                                                            
                                                  super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(this->label_stack_).
                                                                                                          
                                                  super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) -
                                  1,out_drop_count,out_keep_count);
  if (RVar1.enum_ != Error) {
    IVar2 = SharedValidator::GetLocalCount(&this->validator_);
    *out_drop_count = *out_drop_count + IVar2;
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::GetReturnDropKeepCount(Index* out_drop_count,
                                                  Index* out_keep_count) {
  CHECK_RESULT(GetBrDropKeepCount(label_stack_.size() - 1, out_drop_count,
                                  out_keep_count));
  *out_drop_count += validator_.GetLocalCount();
  return Result::Ok;
}